

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolyConnectivity.hh
# Opt level: O0

ConstFaceVertexIter * __thiscall
OpenMesh::PolyConnectivity::cfv_end(PolyConnectivity *this,FaceHandle _fh)

{
  undefined4 in_EDX;
  undefined8 in_RSI;
  GenericCirculatorT_DEPRECATED<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
  *in_RDI;
  FaceHandle unaff_retaddr;
  undefined4 in_stack_fffffffffffffff0;
  
  Iterators::
  GenericCirculatorT_DEPRECATED<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
  ::GenericCirculatorT_DEPRECATED
            (in_RDI,(mesh_ref)CONCAT44(in_EDX,in_stack_fffffffffffffff0),unaff_retaddr,
             SUB81((ulong)in_RSI >> 0x38,0));
  return in_RDI;
}

Assistant:

ConstFaceVertexIter cfv_end(FaceHandle _fh) const
  { return ConstFaceVertexIter(*this, _fh, true); }